

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void clear_branch_hflags(DisasContext_conflict6 *ctx)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i32 ret;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ctx->hflags = ctx->hflags & 0xff7807ff;
  if ((ctx->base).is_jmp != DISAS_NEXT) {
    ret = tcg_ctx->hflags;
    tcg_gen_andi_i32_mips64el(tcg_ctx,ret,ret,-0x87f801);
    return;
  }
  save_cpu_state(ctx,0);
  return;
}

Assistant:

static inline void clear_branch_hflags(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    ctx->hflags &= ~MIPS_HFLAG_BMASK;
    if (ctx->base.is_jmp == DISAS_NEXT) {
        save_cpu_state(ctx, 0);
    } else {
        /*
         * It is not safe to save ctx->hflags as hflags may be changed
         * in execution time by the instruction in delay / forbidden slot.
         */
        tcg_gen_andi_i32(tcg_ctx, tcg_ctx->hflags, tcg_ctx->hflags, ~MIPS_HFLAG_BMASK);
    }
}